

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O0

argument * __thiscall
argParserAdvancedConfiguration::getArgument(argParserAdvancedConfiguration *this,string *param)

{
  value_type psVar1;
  value_type __lhs;
  bool bVar2;
  __type _Var3;
  size_type sVar4;
  reference ppsVar5;
  reference ppaVar6;
  argument *arg;
  int argIndex;
  section *sec;
  int secIndex;
  string *param_local;
  argParserAdvancedConfiguration *this_local;
  
  sec._4_4_ = 0;
  do {
    sVar4 = std::
            vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            ::size(this->newargconfig);
    if (sVar4 <= (ulong)(long)sec._4_4_) {
      std::__cxx11::string::operator=((string *)&this->lastFailedArg,(string *)param);
      return (argument *)0x0;
    }
    ppsVar5 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::at(this->newargconfig,(long)sec._4_4_);
    psVar1 = *ppsVar5;
    for (arg._4_4_ = 0;
        sVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::size(psVar1->arguments), (ulong)(long)arg._4_4_ < sVar4; arg._4_4_ = arg._4_4_ + 1
        ) {
      ppaVar6 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at(psVar1->arguments,(long)arg._4_4_);
      __lhs = *ppaVar6;
      bVar2 = std::operator!=(param,"");
      if (bVar2) {
        _Var3 = std::operator==(&__lhs->argShort,param);
        if (_Var3) {
          return __lhs;
        }
        _Var3 = std::operator==(&__lhs->argLong,param);
        if (_Var3) {
          return __lhs;
        }
      }
    }
    sec._4_4_ = sec._4_4_ + 1;
  } while( true );
}

Assistant:

argParserAdvancedConfiguration::argument * argParserAdvancedConfiguration::getArgument(string param){

    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++)
    {
        section * sec;
        sec = newargconfig->at(secIndex);

        for(int argIndex = 0; argIndex < sec->arguments->size();argIndex++) {
            argument * arg = sec->arguments->at(argIndex);
                if (param != "" && (arg->argShort == param || arg->argLong == param)) {
                    return arg;
                }
            }
    }
    lastFailedArg = param;
    return nullptr;
}